

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backtracer-inl.h
# Opt level: O3

void __thiscall spdlog::details::backtracer::push_back(backtracer *this,log_msg *msg)

{
  int iVar1;
  log_msg_buffer local_190;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar1 == 0) {
    log_msg_buffer::log_msg_buffer(&local_190,msg);
    circular_q<spdlog::details::log_msg_buffer>::push_back(&this->messages_,&local_190);
    if (local_190.buffer.super_buffer<char>.ptr_ != local_190.buffer.store_) {
      operator_delete(local_190.buffer.super_buffer<char>.ptr_);
    }
    pthread_mutex_unlock((pthread_mutex_t *)this);
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

SPDLOG_INLINE void backtracer::push_back(const log_msg &msg)
{
    std::lock_guard<std::mutex> lock{mutex_};
    messages_.push_back(log_msg_buffer{msg});
}